

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weak_ptr_ipp.hpp
# Opt level: O1

shared_ptr<duckdb::DuckDB,_true> __thiscall
duckdb::weak_ptr<duckdb::DuckDB,_true>::lock(weak_ptr<duckdb::DuckDB,_true> *this)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar4;
  shared_ptr<duckdb::DuckDB,_true> sVar5;
  
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[1];
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar2 = this_00->_M_use_count;
    do {
      if (iVar2 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar4 = iVar2 == iVar1;
      if (bVar4) {
        this_00->_M_use_count = iVar2 + 1;
        iVar1 = iVar2;
      }
      iVar2 = iVar1;
      UNLOCK();
    } while (!bVar4);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (this->internal).super___weak_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->internal).super___weak_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (this_00->_M_use_count == 0) {
      peVar3 = (element_type *)0x0;
    }
    else {
      peVar3 = (element_type *)*in_RSI;
    }
    (this->internal).super___weak_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
    (this->internal).super___weak_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = this_00;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    in_RDX._M_pi = extraout_RDX;
  }
  sVar5.internal.super___shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar5.internal.super___shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::DuckDB,_true>)
         sVar5.internal.super___shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<T, SAFE> lock() const { // NOLINT: invalid case style
		return shared_ptr<T, SAFE>(internal.lock());
	}